

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

void __thiscall gnl::Epoll::~Epoll(Epoll *this)

{
  int in_ESI;
  Epoll *this_local;
  
  close(this,in_ESI);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::~vector(&this->events);
  return;
}

Assistant:

Epoll::~Epoll() {
    this->close();
}